

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routing_table.cpp
# Opt level: O3

bool __thiscall
libtorrent::dht::all_in_same_bucket
          (dht *this,span<const_libtorrent::dht::node_entry> b,node_id *id,int bucket_index)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int counter [2];
  
  iVar1 = (int)id;
  iVar4 = iVar1 + 7;
  if (-1 < iVar1) {
    iVar4 = iVar1;
  }
  uVar2 = 0x80 >> ((byte)id & 7);
  counter[0] = 0;
  counter[1] = 0;
  counter[(uVar2 & *(byte *)(b.m_len + (long)(iVar4 >> 3))) != 0] =
       counter[(uVar2 & *(byte *)(b.m_len + (long)(iVar4 >> 3))) != 0] + 1;
  if (b.m_ptr != (node_entry *)0x0) {
    lVar3 = 0;
    do {
      counter[(uVar2 & (byte)this[lVar3 + (long)(iVar4 >> 3) + 0x10]) != 0] =
           counter[(uVar2 & (byte)this[lVar3 + (long)(iVar4 >> 3) + 0x10]) != 0] + 1;
      lVar3 = lVar3 + 0x40;
    } while ((long)b.m_ptr * 0x40 != lVar3);
  }
  return counter[1] == 0 || counter[0] == 0;
}

Assistant:

bool all_in_same_bucket(span<node_entry const> b, node_id const& id, int const bucket_index)
{
	int const byte_offset = bucket_index / 8;
	int const bit_offset = bucket_index % 8;
	std::uint8_t const mask = 0x80 >> bit_offset;
	int counter[2] = {0, 0};
	int const i =  (id[byte_offset] & mask) ? 1 : 0;
	++counter[i];
	for (auto const& e : b)
	{
		int const idx =  (e.id[byte_offset] & mask) ? 1 : 0;
		++counter[idx];
	}
	return counter[0] == 0 || counter[1] == 0;
}